

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# http_context.cpp
# Opt level: O0

void __thiscall
cppcms::http::context::submit_to_asynchronous_application
          (context *this,intrusive_ptr<cppcms::application> *app,string *matched)

{
  int iVar1;
  element_type *peVar2;
  undefined4 extraout_var;
  string *in_RDX;
  dispatch_binder *in_RDI;
  dispatch_binder bd;
  context *in_stack_ffffffffffffff18;
  dispatch_binder *pdVar4;
  dispatch_binder *in_stack_ffffffffffffff40;
  dispatch_binder *in_stack_ffffffffffffff88;
  callback<void_()> *in_stack_ffffffffffffff90;
  undefined1 local_48 [40];
  undefined1 local_20;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_8
  local_18;
  callback *pcVar3;
  
  local_18._M_allocated_capacity = (size_type)in_RDX;
  self(in_stack_ffffffffffffff18);
  pdVar4 = (dispatch_binder *)local_48;
  booster::intrusive_ptr<cppcms::application>::intrusive_ptr
            ((intrusive_ptr<cppcms::application> *)in_RDI,
             (intrusive_ptr<cppcms::application> *)in_stack_ffffffffffffff18);
  std::__cxx11::string::string((string *)(local_48 + 8),(string *)local_18._M_allocated_capacity);
  local_20 = 0;
  peVar2 = std::
           __shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
           ::operator->((__shared_ptr_access<cppcms::impl::cgi::connection,_(__gnu_cxx::_Lock_policy)2,_false,_false>
                         *)0x3a1808);
  iVar1 = (*peVar2->_vptr_connection[0xc])();
  pcVar3 = (callback *)CONCAT44(extraout_var,iVar1);
  anon_unknown_3::dispatch_binder::dispatch_binder(in_stack_ffffffffffffff40,pdVar4);
  booster::callback<void_()>::callback<cppcms::http::(anonymous_namespace)::dispatch_binder>
            (in_stack_ffffffffffffff90,in_stack_ffffffffffffff88);
  booster::aio::io_service::post(pcVar3);
  booster::callback<void_()>::~callback((callback<void_()> *)0x3a1859);
  anon_unknown_3::dispatch_binder::~dispatch_binder(in_RDI);
  anon_unknown_3::dispatch_binder::~dispatch_binder(in_RDI);
  return;
}

Assistant:

void context::submit_to_asynchronous_application(booster::intrusive_ptr<application> app,std::string const &matched)
{
	dispatch_binder bd = { &context::dispatch, self(), app,matched,false };
	conn_->get_io_service().post(bd);
}